

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O1

objc_slot2 * objc_slot_lookup_super2(objc_super *super,SEL selector)

{
  Class object;
  dtable_t pSVar1;
  _InitializingDtable *p_Var2;
  objc_slot2 *poVar3;
  dtable_t pSVar4;
  uintptr_t addr;
  dtable_t pSVar5;
  
  pSVar4 = uninstalled_dtable;
  if (super->receiver == (id)0x0) {
    return (objc_slot2 *)&nil_slot;
  }
  object = super->class;
  pSVar5 = (dtable_t)object->dtable;
  if ((dtable_t)object->dtable == uninstalled_dtable) {
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    pSVar1 = uninstalled_dtable;
    pSVar5 = (dtable_t)object->dtable;
    p_Var2 = temporary_dtables;
    if (temporary_dtables != (InitializingDtable *)0x0 && pSVar5 == uninstalled_dtable) {
      do {
        if (p_Var2->class == object) {
          pSVar4 = p_Var2->dtable;
          break;
        }
        p_Var2 = p_Var2->next;
      } while (p_Var2 != (_InitializingDtable *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
    if ((pSVar5 == pSVar1) && (pSVar5 = pSVar4, pSVar4 != uninstalled_dtable)) {
      objc_sync_enter((id_conflict)object);
      objc_sync_exit((id_conflict)object);
    }
  }
  poVar3 = (objc_slot2 *)
           (*(code *)(&DAT_00121b20 +
                     *(int *)(&DAT_00121b20 +
                             (ulong)(pSVar5->shift << 0x1d | pSVar5->shift >> 3) * 4)))();
  return poVar3;
}

Assistant:

struct objc_slot2 *objc_slot_lookup_super2(struct objc_super *super, SEL selector)
{
	id receiver = super->receiver;
	if (receiver)
	{
		Class class = super->class;
		struct objc_slot2 * result = objc_dtable_lookup(dtable_for_class(class),
				selector->index);
		if (0 == result)
		{
			Class class = classForObject(receiver);
			// Dtable should always be installed in the superclass in
			// Objective-C, but may not be for other languages (Python).
			if (dtable_for_class(class) == uninstalled_dtable)
			{
				if (class_isMetaClass(class))
				{
					objc_send_initialize(receiver);
				}
				else
				{
					objc_send_initialize((id)class);
				}
				objc_send_initialize((id)class);
				return objc_slot_lookup_super2(super, selector);
			}
			uncacheable_slot.imp = __objc_msg_forward2(receiver, selector);
			return (struct objc_slot2*)&uncacheable_slot;
		}
		return result;
	}
	return (struct objc_slot2*)&nil_slot;
}